

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O0

LY_ERR lys_check_features(lysp_module *pmod)

{
  lysp_feature *local_28;
  lysp_feature *f;
  uint32_t i;
  LY_ERR r;
  lysp_module *pmod_local;
  
  f._0_4_ = 0;
  local_28 = (lysp_feature *)0x0;
  _i = pmod;
  while( true ) {
    do {
      local_28 = lysp_feature_next(local_28,_i,(uint32_t *)&f);
      if (local_28 == (lysp_feature *)0x0) {
        return LY_SUCCESS;
      }
    } while (((local_28->flags & 0x20) == 0) || (local_28->iffeatures == (lysp_qname *)0x0));
    if (local_28->iffeatures_c == (lysc_iffeature *)0x0) {
      __assert_fail("f->iffeatures_c",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_features.c"
                    ,0x229,"LY_ERR lys_check_features(const struct lysp_module *)");
    }
    f._4_4_ = lysc_iffeature_value(local_28->iffeatures_c);
    if (f._4_4_ == LY_ENOT) {
      ly_log(_i->mod->ctx,LY_LLERR,LY_EDENIED,
             "Feature \"%s\" cannot be enabled because its \"if-feature\" is not satisfied.",
             local_28->name);
      return LY_EDENIED;
    }
    if (f._4_4_ != LY_SUCCESS) break;
    f._4_4_ = 0;
  }
  return f._4_4_;
}

Assistant:

LY_ERR
lys_check_features(const struct lysp_module *pmod)
{
    LY_ERR r;
    uint32_t i = 0;
    struct lysp_feature *f = NULL;

    while ((f = lysp_feature_next(f, pmod, &i))) {
        if (!(f->flags & LYS_FENABLED) || !f->iffeatures) {
            /* disabled feature or no if-features to check */
            continue;
        }

        assert(f->iffeatures_c);
        r = lysc_iffeature_value(f->iffeatures_c);
        if (r == LY_ENOT) {
            LOGERR(pmod->mod->ctx, LY_EDENIED, "Feature \"%s\" cannot be enabled because its \"if-feature\" is not satisfied.",
                    f->name);
            return LY_EDENIED;
        } else if (r) {
            return r;
        } /* else if-feature satisfied */
    }

    return LY_SUCCESS;
}